

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *
testing::internal::
ActionResultHolder<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>::
PerformDefaultAction<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&,std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&)>
          (FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *this;
  Result local_70;
  ReferenceOrValueWrapper<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>
  local_48;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_> *)
         operator_new(0x30);
  FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::PerformDefaultAction
            (&local_70,
             (FunctionMocker<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
              *)args_local,(ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>::
  ReferenceOrValueWrapper(&local_48,&local_70);
  ActionResultHolder<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>::
  ActionResultHolder(this,&local_48);
  ReferenceOrValueWrapper<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>::
  ~ReferenceOrValueWrapper(&local_48);
  std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr(&local_70);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }